

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_first_sibling(lyd_node *node)

{
  lyd_node *local_20;
  lyd_node *start;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else {
    local_20 = node;
    if (node->parent == (lyd_node *)0x0) {
      while (local_20->prev->next != (lyd_node *)0x0) {
        local_20 = local_20->prev;
      }
    }
    else {
      local_20 = node->parent->child;
    }
    node_local = local_20;
  }
  return node_local;
}

Assistant:

lyd_node *
lyd_first_sibling(struct lyd_node *node)
{
    struct lyd_node *start;

    if (!node) {
        return NULL;
    }

    /* get the first sibling */
    if (node->parent) {
        start = node->parent->child;
    } else {
        for (start = node; start->prev->next; start = start->prev);
    }

    return start;
}